

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O2

int AF_A_Punch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  AWeapon *this_00;
  PClass *pPVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  APowerStrength *pAVar6;
  AActor *this_01;
  char *__assertion;
  int iVar7;
  FSoundID local_6c;
  FName local_68;
  FName local_64;
  undefined1 local_60 [32];
  FTranslatedLineTarget t;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051fb1e;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0051fb0e;
  this_01 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_01 == (AActor *)0x0) goto LAB_0051f915;
    bVar3 = DObject::IsKindOf((DObject *)this_01,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0051fb1e;
    }
  }
  else {
    if (this_01 != (AActor *)0x0) goto LAB_0051fb0e;
LAB_0051f915:
    this_01 = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0051fb0e:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0051fb1e;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051fb1e;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_0051fb0e;
    }
    if ((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar5 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_0051f999;
        if (pvVar5 == (void *)0x0) goto LAB_0051f997;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0051fb1e:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1f,"int AF_A_Punch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_0051f997:
  pvVar5 = (void *)0x0;
LAB_0051f999:
  if ((((this_01->player != (player_t *)0x0) &&
       (this_00 = this_01->player->ReadyWeapon, this_00 != (AWeapon *)0x0)) &&
      (pvVar5 != (void *)0x0 && ((this_00->super_AInventory).field_0x4de & 1) == 0)) &&
     ((*(int *)((long)pvVar5 + 8) == 1 &&
      (bVar3 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), !bVar3)))) {
    return 0;
  }
  iVar4 = FRandom::operator()(&pr_punch);
  iVar7 = (iVar4 % 10) * 2 + 2;
  pAVar6 = AActor::FindInventory<APowerStrength>(this_01);
  iVar4 = iVar7 * 10;
  if (pAVar6 == (APowerStrength *)0x0) {
    iVar4 = iVar7;
  }
  iVar7 = FRandom::Random2(&pr_punch);
  pPVar2 = (PClass *)((double)iVar7 * 0.02197265625 + (this_01->Angles).Yaw.Degrees);
  local_60._16_8_ = (DObject *)0x0;
  local_60._24_8_ = pPVar2;
  P_AimLineAttack((AActor *)local_60,(DAngle *)this_01,64.0,
                  (FTranslatedLineTarget *)(local_60 + 0x18),(DAngle *)0x0,(int)local_60 + 0x10,
                  (AActor *)0x0,(AActor *)0x0);
  local_64.Index = 0x84;
  local_68.Index = 0x40;
  local_60._8_8_ = pPVar2;
  P_LineAttack(this_01,(DAngle *)(local_60 + 8),64.0,(DAngle *)local_60,iVar4,&local_64,&local_68,1,
               &t,(int *)0x0);
  if (t.linetarget != (AActor *)0x0) {
    local_6c.ID = S_FindSound("*fist");
    S_Sound(this_01,1,&local_6c,1.0,1.0);
    (this_01->Angles).Yaw.Degrees = t.angleFromSource.Degrees;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Punch)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	FTranslatedLineTarget t;

	if (self->player != NULL)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != NULL && !(weapon->WeaponFlags & WIF_DEHAMMO) && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire))
				return 0;
		}
	}

	damage = (pr_punch()%10+1)<<1;

	if (self->FindInventory<APowerStrength>())	
		damage *= 10;

	angle = self->Angles.Yaw + pr_punch.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, MELEERANGE);

	P_LineAttack (self, angle, MELEERANGE, pitch, damage, NAME_Melee, NAME_BulletPuff, LAF_ISMELEEATTACK, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON, "*fist", 1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
	}
	return 0;
}